

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O2

LOs __thiscall Omega_h::Dist::items2dest_idxs(Dist *this)

{
  LO size_in;
  void *extraout_RDX;
  Dist *in_RSI;
  LOs LVar1;
  allocator local_d9;
  Write<int> local_d8;
  string local_c8;
  Dist inverse;
  
  invert(&inverse,in_RSI);
  size_in = ndests(in_RSI);
  std::__cxx11::string::string((string *)&local_c8,"",&local_d9);
  Read<int>::Read((Read<int> *)&local_d8,size_in,0,1,&local_c8);
  exch<int>(this,(Read<int> *)&inverse,(Int)&local_d8);
  Write<int>::~Write(&local_d8);
  std::__cxx11::string::~string((string *)&local_c8);
  ~Dist(&inverse);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs Dist::items2dest_idxs() const {
  auto inverse = invert();
  return inverse.exch(LOs(ndests(), 0, 1), 1);
}